

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_extract.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::UnionExtractBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ScalarFunction *pSVar2;
  undefined8 uVar3;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var4;
  int iVar5;
  reference pvVar6;
  pointer pEVar7;
  idx_t __n;
  reference pvVar8;
  type expr;
  string *str;
  string *psVar9;
  BinderException *pBVar10;
  LogicalType *pLVar11;
  InternalException *this_00;
  ParameterNotResolvedException *this_01;
  idx_t i;
  idx_t iVar12;
  bool bVar13;
  string key;
  string message;
  LogicalType return_type;
  Value key_val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  candidates;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  closest_settings;
  string local_178;
  ScalarFunction *local_158;
  undefined1 local_150 [32];
  LogicalType local_130;
  string local_118;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_f8;
  idx_t local_f0;
  Value local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  if ((pEVar7->return_type).id_ == UNKNOWN) {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
  }
  else {
    local_158 = bound_function;
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    if ((pEVar7->return_type).id_ != UNION) {
      pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
      local_e8.type_._0_8_ = (long)&local_e8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"union_extract can only take a union parameter","");
      BinderException::BinderException(pBVar10,(string *)&local_e8);
      __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_f8._M_head_impl = (FunctionData *)this;
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    __n = UnionType::GetMemberCount(&pEVar7->return_type);
    if (__n == 0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_e8.type_._0_8_ = (long)&local_e8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"Can\'t extract something from an empty union","");
      InternalException::InternalException(this_00,(string *)&local_e8);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    pvVar8 = vector<duckdb::LogicalType,_true>::operator[]
                       (&(local_158->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
    if (pvVar8 != &pEVar7->return_type) {
      pvVar8->id_ = (pEVar7->return_type).id_;
      pvVar8->physical_type_ = (pEVar7->return_type).physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&pvVar8->type_info_,&(pEVar7->return_type).type_info_);
    }
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,1);
    pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar6);
    iVar5 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[6])(pEVar7);
    if ((char)iVar5 == '\0') {
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar6);
      if ((pEVar7->return_type).id_ == VARCHAR) {
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar6);
        iVar5 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar7);
        if ((char)iVar5 != '\0') {
          expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar6);
          ExpressionExecutor::EvaluateScalar(&local_e8,context,expr,false);
          str = StringValue::Get_abi_cxx11_(&local_e8);
          if ((local_e8.is_null == false) && (str->_M_string_length != 0)) {
            StringUtil::Lower(&local_178,(string *)str);
            LogicalType::LogicalType(&local_130);
            iVar12 = 0;
            while( true ) {
              pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       ::operator[](arguments,0);
              pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator->(pvVar6);
              psVar9 = UnionType::GetMemberName_abi_cxx11_(&pEVar7->return_type,iVar12);
              StringUtil::Lower((string *)local_150,psVar9);
              uVar3 = local_150._0_8_;
              if (local_150._8_8_ == local_178._M_string_length) {
                if (local_150._8_8_ == 0) {
                  bVar13 = true;
                }
                else {
                  iVar5 = bcmp((void *)local_150._0_8_,local_178._M_dataplus._M_p,local_150._8_8_);
                  bVar13 = iVar5 == 0;
                }
              }
              else {
                bVar13 = false;
              }
              if ((undefined1 *)uVar3 != local_150 + 0x10) {
                operator_delete((void *)uVar3);
              }
              if (bVar13) break;
              iVar12 = iVar12 + 1;
              if (__n == iVar12) {
                local_a8.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_a8.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_a8.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_a8,__n);
                iVar12 = 0;
                do {
                  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           ::operator[](arguments,0);
                  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           ::operator->(pvVar6);
                  psVar9 = UnionType::GetMemberName_abi_cxx11_(&pEVar7->return_type,iVar12);
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_a8,(value_type *)psVar9);
                  iVar12 = iVar12 + 1;
                } while (__n != iVar12);
                StringUtil::TopNJaroWinkler(&local_48,&local_a8,&local_178,5,0.5);
                paVar1 = &local_118.field_2;
                local_118._M_dataplus._M_p = (pointer)paVar1;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_118,"Candidate Entries","");
                StringUtil::CandidatesMessage((string *)local_150,&local_48,&local_118);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != paVar1) {
                  operator_delete(local_118._M_dataplus._M_p);
                }
                pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
                local_118._M_dataplus._M_p = (pointer)paVar1;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_118,"Could not find key \"%s\" in union\n%s","");
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_68,local_178._M_dataplus._M_p,
                           local_178._M_dataplus._M_p + local_178._M_string_length);
                local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_88,local_150._0_8_,
                           (pointer)(local_150._0_8_ + local_150._8_8_));
                BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                          (pBVar10,(string *)&local_118,&local_68,&local_88);
                __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
            }
            local_f0 = iVar12;
            pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::operator[](arguments,0);
            pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(pvVar6);
            pLVar11 = UnionType::GetMemberType(&pEVar7->return_type,iVar12);
            _Var4._M_head_impl = local_f8._M_head_impl;
            pSVar2 = local_158;
            if (&local_130 != pLVar11) {
              local_130.id_ = pLVar11->id_;
              local_130.physical_type_ = pLVar11->physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&local_130.type_info_,&pLVar11->type_info_);
            }
            if (&(pSVar2->super_BaseScalarFunction).return_type != &local_130) {
              (pSVar2->super_BaseScalarFunction).return_type.id_ = local_130.id_;
              (pSVar2->super_BaseScalarFunction).return_type.physical_type_ =
                   local_130.physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&(pSVar2->super_BaseScalarFunction).return_type.type_info_,
                         &local_130.type_info_);
            }
            make_uniq<duckdb::UnionExtractBindData,std::__cxx11::string&,unsigned_long&,duckdb::LogicalType&>
                      ((duckdb *)local_150,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_178,&local_f0,&local_130);
            (_Var4._M_head_impl)->_vptr_FunctionData = (_func_int **)local_150._0_8_;
            LogicalType::~LogicalType(&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p);
            }
            Value::~Value(&local_e8);
            return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                   (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                   _Var4._M_head_impl;
          }
          pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_178,
                     "Key name for union_extract needs to be neither NULL nor empty","");
          BinderException::BinderException(pBVar10,(string *)&local_178);
          __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
      local_e8.type_._0_8_ = (long)&local_e8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"Key name for union_extract needs to be a constant string","");
      BinderException::BinderException(pBVar10,(string *)&local_e8);
      __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_01);
  }
  __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

static unique_ptr<FunctionData> UnionExtractBind(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);
	if (arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	if (arguments[0]->return_type.id() != LogicalTypeId::UNION) {
		throw BinderException("union_extract can only take a union parameter");
	}
	idx_t union_member_count = UnionType::GetMemberCount(arguments[0]->return_type);
	if (union_member_count == 0) {
		throw InternalException("Can't extract something from an empty union");
	}
	bound_function.arguments[0] = arguments[0]->return_type;

	auto &key_child = arguments[1];
	if (key_child->HasParameter()) {
		throw ParameterNotResolvedException();
	}

	if (key_child->return_type.id() != LogicalTypeId::VARCHAR || !key_child->IsFoldable()) {
		throw BinderException("Key name for union_extract needs to be a constant string");
	}
	Value key_val = ExpressionExecutor::EvaluateScalar(context, *key_child);
	D_ASSERT(key_val.type().id() == LogicalTypeId::VARCHAR);
	auto &key_str = StringValue::Get(key_val);
	if (key_val.IsNull() || key_str.empty()) {
		throw BinderException("Key name for union_extract needs to be neither NULL nor empty");
	}
	string key = StringUtil::Lower(key_str);

	LogicalType return_type;
	idx_t key_index = 0;
	bool found_key = false;

	for (size_t i = 0; i < union_member_count; i++) {
		auto &member_name = UnionType::GetMemberName(arguments[0]->return_type, i);
		if (StringUtil::Lower(member_name) == key) {
			found_key = true;
			key_index = i;
			return_type = UnionType::GetMemberType(arguments[0]->return_type, i);
			break;
		}
	}

	if (!found_key) {
		vector<string> candidates;
		candidates.reserve(union_member_count);
		for (idx_t i = 0; i < union_member_count; i++) {
			candidates.push_back(UnionType::GetMemberName(arguments[0]->return_type, i));
		}
		auto closest_settings = StringUtil::TopNJaroWinkler(candidates, key);
		auto message = StringUtil::CandidatesMessage(closest_settings, "Candidate Entries");
		throw BinderException("Could not find key \"%s\" in union\n%s", key, message);
	}

	bound_function.return_type = return_type;
	return make_uniq<UnionExtractBindData>(key, key_index, return_type);
}